

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

void refs_free(refs_t *r)

{
  int iVar1;
  ref_entry *__ptr;
  byte bVar2;
  uint uVar3;
  kh_refs_t *__ptr_00;
  
  iVar1 = r->count;
  r->count = iVar1 + -1;
  if (r != (refs_t *)0x0 && iVar1 < 2) {
    if (r->pool != (string_alloc_t *)0x0) {
      string_pool_destroy(r->pool);
    }
    __ptr_00 = r->h_meta;
    if (__ptr_00 != (kh_refs_t *)0x0) {
      bVar2 = 0;
      for (uVar3 = 0; uVar3 != __ptr_00->n_buckets; uVar3 = uVar3 + 1) {
        if (((__ptr_00->flags[uVar3 >> 4] >> (bVar2 & 0x1e) & 3) == 0) &&
           (__ptr = __ptr_00->vals[uVar3], __ptr != (ref_entry *)0x0)) {
          free(__ptr->seq);
          free(__ptr);
          __ptr_00 = r->h_meta;
        }
        bVar2 = bVar2 + 2;
      }
      free(__ptr_00->keys);
      free(__ptr_00->flags);
      free(__ptr_00->vals);
      free(__ptr_00);
    }
    free(r->ref_id);
    if (r->fp != (BGZF *)0x0) {
      bgzf_close(r->fp);
    }
    pthread_mutex_destroy((pthread_mutex_t *)&r->lock);
    free(r);
    return;
  }
  return;
}

Assistant:

void refs_free(refs_t *r) {
    RP("refs_free()\n");

    if (--r->count > 0)
	return;

    if (!r)
	return;

    if (r->pool)
	string_pool_destroy(r->pool);

    if (r->h_meta) {
	khint_t k;

	for (k = kh_begin(r->h_meta); k != kh_end(r->h_meta); k++) {
	    ref_entry *e;

	    if (!kh_exist(r->h_meta, k))
		continue;
	    if (!(e = kh_val(r->h_meta, k)))
		continue;
	    if (e->seq)
		free(e->seq);
	    free(e);
	}

	kh_destroy(refs, r->h_meta);
    }
    
    if (r->ref_id)
	free(r->ref_id);

    if (r->fp)
	bgzf_close(r->fp);

    pthread_mutex_destroy(&r->lock);

    free(r);
}